

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selu_x86.cpp
# Opt level: O3

int __thiscall ncnn::SELU_x86::forward_inplace(SELU_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  undefined1 (*pauVar6) [16];
  long lVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar14;
  undefined8 uVar13;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  
  iVar1 = bottom_top_blob->c;
  if (0 < (long)iVar1) {
    uVar5 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    lVar7 = 0;
    do {
      pauVar6 = (undefined1 (*) [16])
                (bottom_top_blob->cstep * lVar7 * bottom_top_blob->elemsize +
                (long)bottom_top_blob->data);
      uVar13._0_4_ = (this->super_SELU).alpha;
      uVar13._4_4_ = (this->super_SELU).lambda;
      if ((int)uVar5 < 4) {
        uVar3 = 0;
      }
      else {
        iVar2 = 3;
        do {
          auVar17 = minps(*pauVar6,ZEXT816(0));
          auVar18._8_4_ = 0x42b0c0a5;
          auVar18._0_8_ = 0x42b0c0a542b0c0a5;
          auVar18._12_4_ = 0x42b0c0a5;
          auVar18 = minps(auVar17,auVar18);
          auVar17._8_4_ = 0xc2b0c0a5;
          auVar17._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar17._12_4_ = 0xc2b0c0a5;
          auVar18 = maxps(auVar18,auVar17);
          fVar12 = auVar18._0_4_ * 1.442695 + 0.5;
          fVar14 = auVar18._4_4_ * 1.442695 + 0.5;
          fVar15 = auVar18._8_4_ * 1.442695 + 0.5;
          fVar16 = auVar18._12_4_ * 1.442695 + 0.5;
          fVar8 = (float)(int)fVar12;
          fVar9 = (float)(int)fVar14;
          fVar10 = (float)(int)fVar15;
          fVar11 = (float)(int)fVar16;
          fVar8 = fVar8 - (float)(-(uint)(fVar12 < fVar8) & 0x3f800000);
          fVar9 = fVar9 - (float)(-(uint)(fVar14 < fVar9) & 0x3f800000);
          fVar10 = fVar10 - (float)(-(uint)(fVar15 < fVar10) & 0x3f800000);
          fVar11 = fVar11 - (float)(-(uint)(fVar16 < fVar11) & 0x3f800000);
          fVar12 = fVar8 * -0.6931472 + auVar18._0_4_;
          fVar14 = fVar9 * -0.6931472 + auVar18._4_4_;
          fVar15 = fVar10 * -0.6931472 + auVar18._8_4_;
          fVar16 = fVar11 * -0.6931472 + auVar18._12_4_;
          auVar18 = maxps(*pauVar6,ZEXT816(0));
          *(float *)*pauVar6 =
               (((float)((int)fVar8 * 0x800000 + 0x3f800000) *
                 (fVar12 + 1.0 +
                 (((((fVar12 * 0.00019875691 + 0.0013981999) * fVar12 + 0.008333452) * fVar12 +
                   0.041665796) * fVar12 + 0.16666666) * fVar12 + 0.5) * fVar12 * fVar12) + -1.0) *
                (float)(undefined4)uVar13 + auVar18._0_4_) * (float)uVar13._4_4_;
          *(float *)(*pauVar6 + 4) =
               (((float)((int)fVar9 * 0x800000 + 0x3f800000) *
                 (fVar14 + 1.0 +
                 (((((fVar14 * 0.00019875691 + 0.0013981999) * fVar14 + 0.008333452) * fVar14 +
                   0.041665796) * fVar14 + 0.16666666) * fVar14 + 0.5) * fVar14 * fVar14) + -1.0) *
                (float)(undefined4)uVar13 + auVar18._4_4_) * (float)uVar13._4_4_;
          *(float *)(*pauVar6 + 8) =
               (((float)((int)fVar10 * 0x800000 + 0x3f800000) *
                 (fVar15 + 1.0 +
                 (((((fVar15 * 0.00019875691 + 0.0013981999) * fVar15 + 0.008333452) * fVar15 +
                   0.041665796) * fVar15 + 0.16666666) * fVar15 + 0.5) * fVar15 * fVar15) + -1.0) *
                (float)(undefined4)uVar13 + auVar18._8_4_) * (float)uVar13._4_4_;
          *(float *)(*pauVar6 + 0xc) =
               (((float)((int)fVar11 * 0x800000 + 0x3f800000) *
                 (fVar16 + 1.0 +
                 (((((fVar16 * 0.00019875691 + 0.0013981999) * fVar16 + 0.008333452) * fVar16 +
                   0.041665796) * fVar16 + 0.16666666) * fVar16 + 0.5) * fVar16 * fVar16) + -1.0) *
                (float)(undefined4)uVar13 + auVar18._12_4_) * (float)uVar13._4_4_;
          pauVar6 = pauVar6 + 1;
          iVar2 = iVar2 + 4;
        } while (iVar2 < (int)uVar5);
        uVar13._0_4_ = (this->super_SELU).alpha;
        uVar13._4_4_ = (this->super_SELU).lambda;
        uVar3 = uVar5 & 0xfffffffc;
      }
      if (uVar5 - uVar3 != 0 && (int)uVar3 <= (int)uVar5) {
        lVar4 = 0;
        do {
          fVar8 = *(float *)(*pauVar6 + lVar4 * 4);
          if (0.0 <= fVar8) {
            fVar8 = fVar8 * (this->super_SELU).lambda;
          }
          else {
            fVar8 = expf(fVar8);
            fVar8 = (fVar8 + -1.0) * (float)((ulong)uVar13 >> 0x20) * (float)uVar13;
          }
          *(float *)(*pauVar6 + lVar4 * 4) = fVar8;
          lVar4 = lVar4 + 1;
        } while (uVar5 - uVar3 != (int)lVar4);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != iVar1);
  }
  return 0;
}

Assistant:

int SELU_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int elempack = bottom_top_blob.elempack;
    int channels = bottom_top_blob.c;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _zero512 = _mm512_setzero_ps();
        __m512 _one512 = _mm512_set1_ps(1.f);
        __m512 _alpha512 = _mm512_set1_ps(alpha);
        __m512 _lambda512 = _mm512_set1_ps(lambda);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);

            __m512 _pos = _mm512_max_ps(_zero512, _p);
            __m512 _neg = _mm512_min_ps(_zero512, _p);

            __m512 _blob = exp512_ps(_neg);
            _blob = _mm512_sub_ps(_blob, _one512);
            _blob = _mm512_mul_ps(_alpha512, _blob);
            _blob = _mm512_mul_ps(_lambda512, _mm512_add_ps(_pos, _blob));

            _mm512_storeu_ps(ptr, _blob);

            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _zero256 = _mm256_setzero_ps();
        __m256 _one256 = _mm256_set1_ps(1.f);
        __m256 _alpha256 = _mm256_set1_ps(alpha);
        __m256 _lambda256 = _mm256_set1_ps(lambda);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);

            __m256 _pos = _mm256_max_ps(_zero256, _p);
            __m256 _neg = _mm256_min_ps(_zero256, _p);

            __m256 _blob = exp256_ps(_neg);
            _blob = _mm256_sub_ps(_blob, _one256);
            _blob = _mm256_mul_ps(_alpha256, _blob);
            _blob = _mm256_mul_ps(_lambda256, _mm256_add_ps(_pos, _blob));

            _mm256_storeu_ps(ptr, _blob);

            ptr += 8;
        }
#endif // __AVX__
        __m128 _zero128 = _mm_setzero_ps();
        __m128 _one128 = _mm_set1_ps(1.f);
        __m128 _alpha128 = _mm_set1_ps(alpha);
        __m128 _lambda128 = _mm_set1_ps(lambda);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);

            __m128 _pos = _mm_max_ps(_zero128, _p);
            __m128 _neg = _mm_min_ps(_zero128, _p);

            __m128 _blob = exp_ps(_neg);
            _blob = _mm_sub_ps(_blob, _one128);
            _blob = _mm_mul_ps(_alpha128, _blob);
            _blob = _mm_mul_ps(_lambda128, _mm_add_ps(_pos, _blob));

            _mm_storeu_ps(ptr, _blob);

            ptr += 4;
        }
#endif // __SSE2__
        float alphaxlambda = alpha * lambda;
        for (; i < size; i++)
        {
            // y = lambda * ( max(0, x) + min(0, alpha * (exp(x) - 1)) )
            if (*ptr < 0)
                *ptr = (expf(*ptr) - 1.f) * alphaxlambda;
            else
                *ptr = *ptr * lambda;
            ptr++;
        }
    }

    return 0;
}